

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

dma_memory memory_allocate_dma(size_t size,_Bool require_contiguous)

{
  uint32_t uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  void *vaddr;
  uintptr_t uVar5;
  int *piVar6;
  ulong __len;
  char *pcVar7;
  dma_memory dVar8;
  undefined8 uStackY_1240;
  char *pcVar9;
  char buf [512];
  char path [4096];
  
  if (VFIO_CONTAINER_FILE_DESCRIPTOR == -1) {
    fprintf(_stderr,"[DEBUG] %s:%d %s(): allocating dma memory via huge page\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x39,
            "memory_allocate_dma");
    uVar1 = huge_pg_id;
    __len = size + 0x1fffff & 0xffffffffffe00000;
    if (require_contiguous && 0x200000 < __len) {
      fprintf(_stderr,"[ERROR] %s:%d %s(): could not map physically contiguous memory\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x42,
              "memory_allocate_dma");
      abort();
    }
    LOCK();
    huge_pg_id = huge_pg_id + 1;
    UNLOCK();
    uVar2 = getpid();
    snprintf(path,0x1000,"/mnt/huge/ixy-%d-%d",(ulong)uVar2,(ulong)uVar1);
    iVar3 = open(path,0x42,0x1c0);
    if (iVar3 == -1) {
      piVar6 = __errno_location();
      iVar3 = *piVar6;
      pcVar9 = buf;
      __xpg_strerror_r(iVar3,pcVar9,0x200);
      pcVar7 = "open hugetlbfs file, check that /mnt/huge is mounted";
      uStackY_1240 = 0x49;
    }
    else {
      iVar4 = ftruncate(iVar3,__len);
      if (iVar4 == -1) {
        piVar6 = __errno_location();
        iVar3 = *piVar6;
        pcVar9 = buf;
        __xpg_strerror_r(iVar3,pcVar9,0x200);
        pcVar7 = "allocate huge page memory, check hugetlbfs configuration";
        uStackY_1240 = 0x4a;
      }
      else {
        vaddr = mmap((void *)0x0,__len,3,0x40001,iVar3,0);
        if (vaddr == (void *)0xffffffffffffffff) {
          piVar6 = __errno_location();
          iVar3 = *piVar6;
          pcVar9 = buf;
          __xpg_strerror_r(iVar3,pcVar9,0x200);
          pcVar7 = "mmap hugepage";
          uStackY_1240 = 0x4b;
        }
        else {
          iVar4 = mlock(vaddr,__len);
          if (iVar4 != -1) {
            close(iVar3);
            unlink(path);
            uVar5 = virt_to_phys(vaddr);
            goto LAB_00102cdc;
          }
          piVar6 = __errno_location();
          iVar3 = *piVar6;
          pcVar9 = buf;
          __xpg_strerror_r(iVar3,pcVar9,0x200);
          pcVar7 = "disable swap for DMA memory";
          uStackY_1240 = 0x4d;
        }
      }
    }
  }
  else {
    fprintf(_stderr,"[DEBUG] %s:%d %s(): allocating dma memory via VFIO\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x2f,
            "memory_allocate_dma");
    vaddr = mmap((void *)0x0,size,3,0x54040021,-1,0);
    if (vaddr != (void *)0xffffffffffffffff) {
      uVar5 = vfio_map_dma(vaddr,(uint32_t)size);
LAB_00102cdc:
      dVar8.phy = uVar5;
      dVar8.virt = vaddr;
      return dVar8;
    }
    piVar6 = __errno_location();
    iVar3 = *piVar6;
    pcVar9 = path;
    __xpg_strerror_r(iVar3,pcVar9,0x200);
    pcVar7 = "mmap hugepage";
    uStackY_1240 = 0x30;
  }
  fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",
          uStackY_1240,"memory_allocate_dma",pcVar7,pcVar9);
  exit(iVar3);
}

Assistant:

struct dma_memory memory_allocate_dma(size_t size, bool require_contiguous) {
	if (VFIO_CONTAINER_FILE_DESCRIPTOR != -1) {
		// VFIO == -1 means that there is no VFIO container set, i.e. VFIO / IOMMU is not activated
		debug("allocating dma memory via VFIO");
		void* virt_addr = (void*) check_err(mmap(NULL, size, PROT_READ | PROT_WRITE, MAP_SHARED | MAP_ANONYMOUS | MAP_HUGETLB | MAP_HUGE_2MB, -1, 0), "mmap hugepage");
		// create IOMMU mapping
		uint64_t iova = (uint64_t) vfio_map_dma(virt_addr, size);
		return (struct dma_memory){
			// for VFIO, this needs to point to the device view memory = IOVA!
			.virt = virt_addr,
			.phy = iova
		};
	} else {
		debug("allocating dma memory via huge page");
		// round up to multiples of 2 MB if necessary, this is the wasteful part
		// this could be fixed by co-locating allocations on the same page until a request would be too large
		// when fixing this: make sure to align on 128 byte boundaries (82599 dma requirement)
		if (size % HUGE_PAGE_SIZE) {
			size = ((size >> HUGE_PAGE_BITS) + 1) << HUGE_PAGE_BITS;
		}
		if (require_contiguous && size > HUGE_PAGE_SIZE) {
			// this is the place to implement larger contiguous physical mappings if that's ever needed
			error("could not map physically contiguous memory");
		}
		// unique filename, C11 stdatomic.h requires a too recent gcc, we want to support gcc 4.8
		uint32_t id = __sync_fetch_and_add(&huge_pg_id, 1);
		char path[PATH_MAX];
		snprintf(path, PATH_MAX, "/mnt/huge/ixy-%d-%d", getpid(), id);
		// temporary file, will be deleted to prevent leaks of persistent pages
		int fd = check_err(open(path, O_CREAT | O_RDWR, S_IRWXU), "open hugetlbfs file, check that /mnt/huge is mounted");
		check_err(ftruncate(fd, (off_t) size), "allocate huge page memory, check hugetlbfs configuration");
		void* virt_addr = (void*) check_err(mmap(NULL, size, PROT_READ | PROT_WRITE, MAP_SHARED | MAP_HUGETLB, fd, 0), "mmap hugepage");
		// never swap out DMA memory
		check_err(mlock(virt_addr, size), "disable swap for DMA memory");
		// don't keep it around in the hugetlbfs
		close(fd);
		unlink(path);
		return (struct dma_memory) {
			.virt = virt_addr,
			.phy = virt_to_phys(virt_addr)
		};
	}
}